

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined4 local_1c;
  char **ppcStack_18;
  GLint maxTextureSize;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(Error);
  glfwInit();
  glfwWindowHint(0x20004,0);
  window = glfwCreateWindow(0xfa,0xfa,*ppcStack_18,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    glGetString(0x1f02);
    glGetString(0x1f00);
    glGetString(0x1f03);
    glGetString(0x1f01);
    glGetString(0x8b8c);
    local_1c = 0;
    glGetIntegerv(0xd33,&local_1c);
    glfwDestroyWindow(window);
    glfwTerminate();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char **argv)
{
   glfwSetErrorCallback(&Error);

   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

   window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
   if (!window) {
      return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   glGetString(GL_VERSION);
   glGetString(GL_VENDOR);
   glGetString(GL_EXTENSIONS);
   glGetString(GL_RENDERER);
   glGetString(GL_SHADING_LANGUAGE_VERSION);
   GLint maxTextureSize = 0;
   glGetIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}